

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editor.cpp
# Opt level: O1

void __thiscall CEditor::RenderGrid(CEditor *this,CLayerGroup *pGroup)

{
  float fVar1;
  float fVar2;
  uint uVar3;
  CUIRect *pCVar4;
  int iVar5;
  ulong uVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  long in_FS_OFFSET;
  float fVar10;
  float fVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  float aGroupPoints [4];
  int local_6c;
  float local_58;
  float local_54;
  float local_50;
  float local_4c;
  float local_48;
  float local_44;
  float local_40;
  float local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->m_GridActive == true) {
    CLayerGroup::Mapping(pGroup,&local_48);
    pCVar4 = CUI::Screen(&this->m_UI);
    fVar1 = pCVar4->w;
    pCVar4 = CUI::Screen(&this->m_UI);
    iVar5 = this->m_ZoomLevel;
    local_6c = 0x10;
    if ((((100 < iVar5) && (local_6c = 0x20, 0xfa < iVar5)) && (local_6c = 0x40, 0x1c2 < iVar5)) &&
       (local_6c = 0x80, 0x352 < iVar5)) {
      local_6c = (uint)(0x60e < iVar5) * 0x100 + 0x100;
    }
    iVar5 = (int)(local_48 / (float)local_6c);
    iVar8 = (int)(local_44 / (float)local_6c);
    fVar2 = pCVar4->h;
    uVar9 = (long)iVar5 % (long)this->m_GridFactor & 0xffffffff;
    uVar6 = (long)iVar8 % (long)this->m_GridFactor & 0xffffffff;
    (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x13])(this->m_pGraphics,0xffffffff);
    (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x14])();
    iVar7 = (int)fVar1;
    if (0 < iVar7) {
      iVar5 = iVar5 * local_6c;
      fVar10 = (float)iVar5;
      iVar8 = iVar8 * local_6c;
      fVar11 = (float)iVar8;
      do {
        uVar3 = *(uint *)(this->m_pConfig->m_ClVersionServer +
                         (ulong)((int)uVar6 % this->m_GridFactor == 0) * 4 + -0x38);
        auVar12._0_4_ = (float)(uVar3 >> 0x18);
        auVar12._4_4_ = (float)(uVar3 >> 0x10 & 0xff);
        auVar12._8_8_ = 0;
        divps(auVar12,_DAT_001dc020);
        auVar14._0_4_ = (float)(uVar3 >> 8 & 0xff);
        auVar14._4_4_ = (float)(uVar3 & 0xff);
        auVar14._8_8_ = 0;
        divps(auVar14,_DAT_001dc020);
        (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x21])();
        local_54 = (float)iVar8;
        local_50 = local_40 + fVar1;
        local_58 = fVar10;
        local_4c = local_54;
        (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x16])
                  (this->m_pGraphics,&local_58,1);
        uVar3 = *(uint *)(this->m_pConfig->m_ClVersionServer +
                         (ulong)((int)uVar9 % this->m_GridFactor == 0) * 4 + -0x38);
        auVar13._0_4_ = (float)(uVar3 >> 0x18);
        auVar13._4_4_ = (float)(uVar3 >> 0x10 & 0xff);
        auVar13._8_8_ = 0;
        divps(auVar13,_DAT_001dc020);
        auVar15._0_4_ = (float)(uVar3 >> 8 & 0xff);
        auVar15._4_4_ = (float)(uVar3 & 0xff);
        auVar15._8_8_ = 0;
        divps(auVar15,_DAT_001dc020);
        (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x21])();
        local_58 = (float)iVar5;
        local_4c = local_3c + fVar2;
        local_54 = fVar11;
        local_50 = local_58;
        (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x16])
                  (this->m_pGraphics,&local_58,1);
        uVar9 = (ulong)((int)uVar9 + 1);
        iVar5 = iVar5 + local_6c;
        iVar8 = iVar8 + local_6c;
        uVar6 = (ulong)((int)uVar6 + 1);
        iVar7 = iVar7 + -1;
      } while (iVar7 != 0);
    }
    (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x21])();
    (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x15])();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CEditor::RenderGrid(CLayerGroup *pGroup)
{
	if(!m_GridActive)
		return;

	vec4 GridColor;
	float aGroupPoints[4];
	pGroup->Mapping(aGroupPoints);

	float w = UI()->Screen()->w;
	float h = UI()->Screen()->h;

	int LineDistance = GetLineDistance();

	int XOffset = aGroupPoints[0]/LineDistance;
	int YOffset = aGroupPoints[1]/LineDistance;
	int XGridOffset = XOffset % m_GridFactor;
	int YGridOffset = YOffset % m_GridFactor;

	Graphics()->TextureClear();
	Graphics()->LinesBegin();

	for(int i = 0; i < (int)w; i++)
	{
		if((i+YGridOffset) % m_GridFactor == 0)
			GridColor = HexToRgba(Config()->m_EdColorGridOuter);
		else
			GridColor = HexToRgba(Config()->m_EdColorGridInner);

		Graphics()->SetColor(GridColor.r, GridColor.g, GridColor.b, GridColor.a);
		IGraphics::CLineItem Line = IGraphics::CLineItem(LineDistance*XOffset, LineDistance*i+LineDistance*YOffset, w+aGroupPoints[2], LineDistance*i+LineDistance*YOffset);
		Graphics()->LinesDraw(&Line, 1);

		if((i+XGridOffset) % m_GridFactor == 0)
			GridColor = HexToRgba(Config()->m_EdColorGridOuter);
		else
			GridColor = HexToRgba(Config()->m_EdColorGridInner);

		Graphics()->SetColor(GridColor.r, GridColor.g, GridColor.b, GridColor.a);
		Line = IGraphics::CLineItem(LineDistance*i+LineDistance*XOffset, LineDistance*YOffset, LineDistance*i+LineDistance*XOffset, h+aGroupPoints[3]);
		Graphics()->LinesDraw(&Line, 1);
	}
	Graphics()->SetColor(1.0f, 1.0f, 1.0f, 1.0f);
	Graphics()->LinesEnd();
}